

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O2

int test_json2map_array(void)

{
  int iVar1;
  uint uVar2;
  char *__s2;
  json2map_t *obj;
  int iVar3;
  
  __s2 = (char *)calloc(0x1fe,0xff);
  obj = json2map_init('\0');
  json2map_registerDataHook(obj,__s2,json2map_hookMethod);
  json2map_parse(obj,(char *)0x0,
                 "{\"array\":[{\"object1\":{\"key1\":\"value1\",\"key2\":2}},{\"array2\":[\"test\",\"test2\"]},\"b\",1]}"
                );
  printf("Expected: \t%s\nActual: \t%s\n\n","array[0].object1.key1",__s2);
  iVar1 = strcmp("array[0].object1.key1",__s2);
  iVar3 = 1;
  if (iVar1 == 0) {
    printf("Expected: \t%s\nActual: \t%s\n\n","value1",__s2 + 0xff);
    iVar1 = strcmp("value1",__s2 + 0xff);
    if (iVar1 == 0) {
      printf("Expected: \t%s\nActual: \t%s\n\n","array[0].object1.key2",__s2 + 0x1fe);
      iVar1 = strcmp("array[0].object1.key2",__s2 + 0x1fe);
      if (iVar1 == 0) {
        printf("Expected: \t%s\nActual: \t%s\n\n","2",__s2 + 0x2fd);
        uVar2 = (byte)__s2[0x2fd] - 0x32;
        if (uVar2 == 0) {
          uVar2 = (uint)(byte)__s2[0x2fe];
        }
        if (uVar2 == 0) {
          printf("Expected: \t%s\nActual: \t%s\n\n","array[1].array2[0]",__s2 + 0x3fc);
          iVar1 = strcmp("array[1].array2[0]",__s2 + 0x3fc);
          if (iVar1 == 0) {
            printf("Expected: \t%s\nActual: \t%s\n\n","test",__s2 + 0x4fb);
            iVar1 = strcmp("test",__s2 + 0x4fb);
            if (iVar1 == 0) {
              printf("Expected: \t%s\nActual: \t%s\n\n","array[1].array2[1]",__s2 + 0x5fa);
              iVar1 = strcmp("array[1].array2[1]",__s2 + 0x5fa);
              if (iVar1 == 0) {
                printf("Expected: \t%s\nActual: \t%s\n\n","test2",__s2 + 0x6f9);
                iVar1 = strcmp("test2",__s2 + 0x6f9);
                if (iVar1 == 0) {
                  printf("Expected: \t%s\nActual: \t%s\n\n","array[1].array2[x]",__s2 + 0x7f8);
                  iVar1 = strcmp("array[1].array2[x]",__s2 + 0x7f8);
                  if (iVar1 == 0) {
                    printf("Expected: \t%s\nActual: \t%s\n\n","2",__s2 + 0x8f7);
                    uVar2 = (byte)__s2[0x8f7] - 0x32;
                    if (uVar2 == 0) {
                      uVar2 = (uint)(byte)__s2[0x8f8];
                    }
                    if (uVar2 == 0) {
                      printf("Expected: \t%s\nActual: \t%s\n\n","array[2]",__s2 + 0x9f6);
                      iVar1 = strcmp("array[2]",__s2 + 0x9f6);
                      if (iVar1 == 0) {
                        printf("Expected: \t%s\nActual: \t%s\n\n","b",__s2 + 0xaf5);
                        uVar2 = (byte)__s2[0xaf5] - 0x62;
                        if (uVar2 == 0) {
                          uVar2 = (uint)(byte)__s2[0xaf6];
                        }
                        if (uVar2 == 0) {
                          printf("Expected: \t%s\nActual: \t%s\n\n","array[3]",__s2 + 0xbf4);
                          iVar1 = strcmp("array[3]",__s2 + 0xbf4);
                          if (iVar1 == 0) {
                            printf("Expected: \t%s\nActual: \t%s\n\n","1",__s2 + 0xcf3);
                            uVar2 = (byte)__s2[0xcf3] - 0x31;
                            if (uVar2 == 0) {
                              uVar2 = (uint)(byte)__s2[0xcf4];
                            }
                            if (uVar2 == 0) {
                              printf("Expected: \t%s\nActual: \t%s\n\n","array[x]",__s2 + 0xdf2);
                              iVar1 = strcmp("array[x]",__s2 + 0xdf2);
                              if (iVar1 == 0) {
                                printf("Expected: \t%s\nActual: \t%s\n\n","4",__s2 + 0xef1);
                                uVar2 = (byte)__s2[0xef1] - 0x34;
                                if (uVar2 == 0) {
                                  uVar2 = (uint)(byte)__s2[0xef2];
                                }
                                if (uVar2 == 0) {
                                  json2map_destroy(obj);
                                  free(__s2);
                                  iVar3 = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int test_json2map_array() {
	keyvalue_t *map = (keyvalue_t *) calloc(sizeof(keyvalue_t), LIST_SIZE);

	json2map_t *json2mapObj = json2map_init(0);
	json2map_registerDataHook(json2mapObj, map, &json2map_hookMethod);
	json2map_parse(json2mapObj, NULL, "{\"array\":[{\"object1\":{\"key1\":\"value1\",\"key2\":2}},{\"array2\":[\"test\",\"test2\"]},\"b\",1]}");

	ASSERTSTR("array[0].object1.key1", map[0].key);
	ASSERTSTR("value1", map[0].value);

	ASSERTSTR("array[0].object1.key2", map[1].key);
	ASSERTSTR("2", map[1].value);

	ASSERTSTR("array[1].array2[0]", map[2].key);
	ASSERTSTR("test", map[2].value);

	ASSERTSTR("array[1].array2[1]", map[3].key);
	ASSERTSTR("test2", map[3].value);

	ASSERTSTR("array[1].array2[x]", map[4].key);
	ASSERTSTR("2", map[4].value);

	ASSERTSTR("array[2]", map[5].key);
	ASSERTSTR("b", map[5].value);

	ASSERTSTR("array[3]", map[6].key);
	ASSERTSTR("1", map[6].value);

	ASSERTSTR("array[x]", map[7].key);
	ASSERTSTR("4", map[7].value);

	json2map_destroy(json2mapObj);
	free(map);
	return 0;
}